

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::MethodDescriptorProto::InternalSwap
          (MethodDescriptorProto *this,MethodDescriptorProto *other)

{
  InternalMetadata *this_00;
  ArenaStringPtr *pAVar1;
  ArenaStringPtr *pAVar2;
  uint32 uVar3;
  void *pvVar4;
  MethodOptions *pMVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  string *psVar10;
  UnknownFieldSet *other_00;
  Arena *pAVar11;
  Arena *arena;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  pAVar11 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  pvVar4 = (other->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar11 & 1) == 0) {
    if (((ulong)pvVar4 & 1) != 0) {
LAB_0029e969:
      other_00 = (UnknownFieldSet *)(((ulong)pvVar4 & 0xfffffffffffffffe) + 8);
      goto LAB_0029e971;
    }
    uVar3 = (this->_has_bits_).has_bits_[0];
    (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
    (other->_has_bits_).has_bits_[0] = uVar3;
LAB_0029e996:
    uVar9 = 0;
    arena = pAVar11;
  }
  else {
    if (((ulong)pvVar4 & 1) != 0) goto LAB_0029e969;
    other_00 = internal::InternalMetadata::
               mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                         (&(other->super_Message).super_MessageLite._internal_metadata_);
LAB_0029e971:
    internal::InternalMetadata::DoSwap<google::protobuf::UnknownFieldSet>(this_00,other_00);
    arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
    uVar3 = (this->_has_bits_).has_bits_[0];
    (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
    (other->_has_bits_).has_bits_[0] = uVar3;
    pAVar11 = arena;
    if (((ulong)arena & 1) == 0) goto LAB_0029e996;
    pAVar11 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    uVar9 = 1;
  }
  pAVar1 = &other->name_;
  psVar10 = (this->name_).ptr_;
  if (psVar10 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar1->ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (&this->name_,pAVar11,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      psVar10 = (this->name_).ptr_;
      goto LAB_0029e9dd;
    }
  }
  else {
LAB_0029e9dd:
    if (pAVar1->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar1,pAVar11,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::swap((string *)psVar10);
    arena = (Arena *)this_00->ptr_;
    uVar9 = (uint)arena & 1;
  }
  pAVar1 = &this->input_type_;
  pAVar11 = arena;
  if (uVar9 != 0) {
    pAVar11 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pAVar2 = &other->input_type_;
  psVar10 = pAVar1->ptr_;
  if (psVar10 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar2->ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar1,pAVar11,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      psVar10 = pAVar1->ptr_;
      goto LAB_0029ea60;
    }
  }
  else {
LAB_0029ea60:
    if (pAVar2->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar2,pAVar11,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::swap((string *)psVar10);
    arena = (Arena *)this_00->ptr_;
    uVar9 = (uint)arena & 1;
  }
  pAVar1 = &this->output_type_;
  if (uVar9 != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pAVar2 = &other->output_type_;
  psVar10 = pAVar1->ptr_;
  if (psVar10 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar2->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_)
    goto LAB_0029eb03;
    internal::ArenaStringPtr::CreateInstance
              (pAVar1,arena,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    psVar10 = pAVar1->ptr_;
  }
  if (pAVar2->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstance
              (pAVar2,arena,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  }
  std::__cxx11::string::swap((string *)psVar10);
LAB_0029eb03:
  pMVar5 = this->options_;
  this->options_ = other->options_;
  other->options_ = pMVar5;
  bVar7 = this->client_streaming_;
  bVar8 = this->server_streaming_;
  bVar6 = other->server_streaming_;
  this->client_streaming_ = other->client_streaming_;
  this->server_streaming_ = bVar6;
  other->client_streaming_ = bVar7;
  other->server_streaming_ = bVar8;
  return;
}

Assistant:

void MethodDescriptorProto::InternalSwap(MethodDescriptorProto* other) {
  using std::swap;
  _internal_metadata_.Swap<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  name_.Swap(&other->name_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  input_type_.Swap(&other->input_type_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  output_type_.Swap(&other->output_type_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(MethodDescriptorProto, server_streaming_)
      + sizeof(MethodDescriptorProto::server_streaming_)
      - PROTOBUF_FIELD_OFFSET(MethodDescriptorProto, options_)>(
          reinterpret_cast<char*>(&options_),
          reinterpret_cast<char*>(&other->options_));
}